

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::delete_obj_table(CVmObjTable *this)

{
  void *pvVar1;
  vm_globalvar_t *in_RDI;
  vm_image_ptr_page *ip_next;
  vm_image_ptr_page *ip_page;
  size_t i;
  CVmObjGlobPage *this_00;
  CVmObjTable *this_01;
  CVmObjTable *local_18;
  void *local_10;
  
  for (local_10 = (void *)0x0; local_10 < in_RDI[1].val.val.ptr;
      local_10 = (void *)((long)local_10 + 1)) {
    free(*(void **)(&(in_RDI->prv->val).typ + (long)local_10 * 2));
  }
  free(in_RDI->prv);
  in_RDI->prv = (vm_globalvar_t *)0x0;
  *(undefined8 *)&in_RDI[1].val = 0;
  in_RDI[1].val.val.ptr = (void *)0x0;
  *(undefined4 *)&in_RDI[1].nxt = 0;
  *(undefined4 *)&in_RDI[2].nxt = 0;
  *(undefined4 *)((long)&in_RDI[2].nxt + 4) = 0;
  *(undefined4 *)&in_RDI[2].prv = 0;
  *(undefined8 *)&in_RDI[3].val = 0;
  this_01 = (CVmObjTable *)0x0;
  local_18 = (CVmObjTable *)in_RDI[1].prv;
  while (local_18 != (CVmObjTable *)0x0) {
    this_01 = *(CVmObjTable **)&local_18->post_load_init_table_;
    free(local_18);
    local_18 = this_01;
  }
  *(undefined8 *)&in_RDI[2].val = 0;
  in_RDI[1].prv = (vm_globalvar_t *)0x0;
  if ((in_RDI->val).val.ptr != (void *)0x0) {
    this_00 = (CVmObjGlobPage *)(in_RDI->val).val.native_desc;
    if (this_00 != (CVmObjGlobPage *)0x0) {
      CVmObjGlobPage::~CVmObjGlobPage(this_00);
      operator_delete(this_00,0x88);
    }
    (in_RDI->val).val.ptr = (void *)0x0;
  }
  while (in_RDI->nxt != (vm_globalvar_t *)0x0) {
    delete_global_var(this_01,in_RDI);
  }
  pvVar1 = *(void **)&in_RDI->val;
  if (pvVar1 != (void *)0x0) {
    CVmHashTable::~CVmHashTable((CVmHashTable *)this_01);
    operator_delete(pvVar1,0x20);
  }
  *(undefined8 *)&in_RDI->val = 0;
  return;
}

Assistant:

void CVmObjTable::delete_obj_table(VMG0_)
{
    /* delete each page we've allocated */
    for (size_t i = 0 ; i < pages_used_ ; ++i)
        t3free(pages_[i]);

    /* free the master page table */
    t3free(pages_);

    /* we no longer have any pages */
    pages_ = 0;
    page_slots_ = 0;
    pages_used_ = 0;

    /* empty out the object lists */
    first_free_ = VM_INVALID_OBJ;
    gc_queue_head_ = VM_INVALID_OBJ;
    finalize_queue_head_ = VM_INVALID_OBJ;

    /* clear the gc statistics */
    allocs_since_gc_ = 0;
    bytes_since_gc_ = 0;

    /* delete each object image data pointer page */
    for (vm_image_ptr_page *ip_page = image_ptr_head_, *ip_next = 0 ;
         ip_page != 0 ; ip_page = ip_next)
    {
        /* remember the next page (before we delete this one) */
        ip_next = ip_page->next_;

        /* delete this page */
        t3free(ip_page);
    }

    /* there's nothing left in the image data list */
    image_ptr_head_ = image_ptr_tail_ = 0;

    /* delete the linked list of globals */
    if (globals_ != 0)
    {
        delete globals_;
        globals_ = 0;
    }

    /* 
     *   delete any left-over global variables (these should always be
     *   deleted by subsystems before we get here, but this is the last
     *   chance, so clean them up manually) 
     */
    while (global_var_head_ != 0)
        delete_global_var(global_var_head_);

    /* delete the post-load initialization table */
    delete post_load_init_table_;
    post_load_init_table_ = 0;
}